

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerResults.cpp
# Opt level: O1

void __thiscall
SMBusAnalyzerResults::GetBubbleText
          (SMBusAnalyzerResults *this,Frame *f,DisplayBase display_base,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  U64 i;
  ulong uVar2;
  char *pcVar3;
  CommandDesc *pCVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  ulong *puVar8;
  char *pcVar9;
  int iVar10;
  undefined8 uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  _Alloc_hider _Var13;
  ulong i_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong i_01;
  bool bVar16;
  string val;
  string rw_s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string unit_on_off;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  char *local_d8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  switch(f[0x20]) {
  case (Frame)0x0:
    if (this->mSettings->mDecodeLevel != DL_Signals) goto LAB_001103f0;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Start","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_198);
    break;
  case (Frame)0x1:
    if (this->mSettings->mDecodeLevel != DL_Signals) goto LAB_001103f0;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Stop","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_198);
    break;
  case (Frame)0x2:
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"0","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_198);
    break;
  case (Frame)0x3:
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"1","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_198);
    break;
  case (Frame)0x4:
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"ACK","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_198);
    break;
  case (Frame)0x5:
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"NACK","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_198);
    break;
  case (Frame)0x6:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,8);
    std::operator+(&local_1d8,"Byte ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    paVar15 = &local_1f8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::operator+(&local_1d8,"Byte ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    local_1f8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    std::__cxx11::string::append((char *)&local_1f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    goto LAB_001103e6;
  case (Frame)0x7:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,0x10);
    std::operator+(&local_1d8,"Word ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    paVar15 = &local_1f8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::operator+(&local_1d8,"Word ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    local_1f8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    std::__cxx11::string::append((char *)&local_1f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    goto LAB_001103e6;
  case (Frame)0x8:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,7);
    bVar16 = ((byte)f[0x21] & 2) == 0;
    pcVar9 = "Read ";
    if (bVar16) {
      pcVar9 = "Write ";
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,pcVar9,pcVar9 + (ulong)bVar16 + 5);
    bVar16 = ((byte)f[0x21] & 2) == 0;
    pcVar9 = "R ";
    if (bVar16) {
      pcVar9 = "W ";
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    pcVar3 = "R ";
    if (bVar16) {
      pcVar3 = "W ";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar9,pcVar3 + 2);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_1f8._M_dataplus._M_p,
               local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_158,(ulong)local_198._M_dataplus._M_p);
    paVar15 = &local_178.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178.field_2._8_8_ = plVar6[3];
      local_178._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_178._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    paVar14 = &local_1b8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    local_1b8._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    std::__cxx11::string::append((char *)&local_1b8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    std::operator+(&local_178,&local_1f8,&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::operator+(&local_178,&local_1f8,&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::operator+(&local_178,&local_1d8,&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::operator+(&local_178,&local_1d8,&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_1d8._M_dataplus._M_p,
               local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_158,(ulong)local_198._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178.field_2._8_8_ = plVar6[3];
      local_178._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_178._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_1d8._M_dataplus._M_p,
               local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_158,(ulong)local_198._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178.field_2._8_8_ = plVar6[3];
      local_178._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_178._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_1f8._M_dataplus._M_p,
               local_1f8._M_dataplus._M_p + local_1f8._M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_198._M_dataplus._M_p);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178.field_2._8_8_ = puVar5[3];
      local_178._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_178._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = puVar5[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    goto LAB_0010e4e8;
  case (Frame)0x9:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,8);
    int2str_sal_abi_cxx11_(&local_1f8,*(U64 *)(f + 0x18),display_base,8);
    if (*(long *)(f + 0x10) == *(long *)(f + 0x18)) {
      std::operator+(&local_1b8,"PEC ",&local_198);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      paVar15 = &local_1d8.field_2;
      puVar8 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_1d8.field_2._M_allocated_capacity = *puVar8;
        local_1d8.field_2._8_8_ = plVar6[3];
        local_1d8._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *puVar8;
        local_1d8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1d8._M_string_length = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar15) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      std::operator+(&local_1d8,&local_198," OK");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar15) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      local_1d8._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"PEC OK","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1d8);
    }
    else {
      std::operator+(&local_178,"Bad PEC ",&local_198);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
      puVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_1b8.field_2._M_allocated_capacity = *puVar8;
        local_1b8.field_2._8_8_ = puVar5[3];
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *puVar8;
        local_1b8._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_1b8._M_string_length = puVar5[1];
      *puVar5 = puVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::operator+(&local_1d8,&local_1b8,&local_1f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1d8);
      paVar15 = &local_1d8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar15) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      std::operator+(&local_1d8,&local_198," bad PEC!");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar15) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      local_1d8._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Bad PEC!","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    goto LAB_001103ca;
  case (Frame)0xa:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,8);
    std::operator+(&local_1f8,"Command ",&local_198);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    std::operator+(&local_1f8,"Cmd ",&local_198);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    goto LAB_0010e4e8;
  case (Frame)0xb:
    pCVar4 = GetPMBusCommandDesc(*(U64 *)(f + 0x10));
    goto LAB_0010b776;
  case (Frame)0xc:
    pCVar4 = GetSmartBatteryCommandDesc(*(U64 *)(f + 0x10));
LAB_0010b776:
    pcVar9 = pCVar4->name;
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,8);
    std::__cxx11::string::string((string *)&local_178,pcVar9,(allocator *)&local_158);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x116342);
    paVar15 = &local_1b8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    paVar1 = &local_1d8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1d8,(ulong)local_198._M_dataplus._M_p);
    paVar14 = &local_1f8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    std::__cxx11::string::string((string *)&local_1f8,pcVar9,(allocator *)&local_1d8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_1d8,pcVar9,(allocator *)&local_1b8);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x11634b);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::operator+(&local_1f8,"Cmd ",&local_198);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_178,pcVar9,(allocator *)&local_158);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x11634b);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = puVar5[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = puVar5[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1d8,(ulong)local_198._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::__cxx11::string::string((string *)&local_1d8,pcVar9,(allocator *)&local_1b8);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x116342);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::operator+(&local_1f8,"Command ",&local_198);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    _Var13._M_p = local_1f8._M_dataplus._M_p;
LAB_0010ffcc:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p == paVar14) goto LAB_001103e6;
    goto LAB_001103d8;
  case (Frame)0xd:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,7);
    std::operator+(&local_1f8,"Byte count ",&local_198);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    paVar15 = &local_1f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::operator+(&local_1f8,"ByteCount ",&local_198);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::operator+(&local_1f8,"Cnt ",&local_198);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    goto LAB_001103e6;
  case (Frame)0xe:
    i = *(U64 *)(f + 0x10);
    pcVar9 = "Reserved, ";
    if (((uint)i & 0x60) == 0x20) {
      pcVar9 = "Max bus speed 400KHz, ";
    }
    local_d8 = "Max bus speed 100KHz, ";
    if ((i & 0x60) != 0) {
      local_d8 = pcVar9;
    }
    int2str_sal_abi_cxx11_(&local_198,i,display_base,8);
    std::operator+(&local_158,"Capability data byte ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178.field_2._8_8_ = plVar6[3];
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_178._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    paVar15 = &local_1b8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    paVar14 = &local_1d8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    paVar1 = &local_1f8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    std::operator+(&local_1d8,"Capability ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::operator+(&local_178,"Capability ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::operator+(&local_158,"Capability ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178.field_2._8_8_ = puVar5[3];
    }
    else {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_178._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = puVar5[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = puVar5[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    pbVar12 = &local_158;
    _Var13._M_p = local_158._M_dataplus._M_p;
    goto LAB_001103d3;
  case (Frame)0xf:
    uVar2 = *(ulong *)(f + 0x10);
    if ((char)uVar2 < '\0') {
      iVar10 = 0x1163f7;
      if ((uVar2 & 0x40) == 0) {
        iVar10 = 0x116371;
      }
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,iVar10,(((uint)uVar2 & 0x40) >> 6) * 9 + iVar10);
      std::operator+(&local_1b8,"Command supported ",&local_198);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      paVar15 = &local_1d8.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1d8.field_2._M_allocated_capacity = *psVar7;
        local_1d8.field_2._8_8_ = plVar6[3];
        local_1d8._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *psVar7;
        local_1d8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1d8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      paVar14 = &local_1f8.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1f8.field_2._M_allocated_capacity = *psVar7;
        local_1f8.field_2._8_8_ = plVar6[3];
        local_1f8._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *psVar7;
        local_1f8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1f8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar14) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar15) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      std::operator+(&local_1b8,"Command supported ",&local_198);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
      puVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_1d8.field_2._M_allocated_capacity = *puVar8;
        local_1d8.field_2._8_8_ = puVar5[3];
        local_1d8._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *puVar8;
        local_1d8._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_1d8._M_string_length = puVar5[1];
      *puVar5 = puVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1f8.field_2._M_allocated_capacity = *psVar7;
        local_1f8.field_2._8_8_ = plVar6[3];
        local_1f8._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *psVar7;
        local_1f8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_1f8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar14) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar15) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p);
      }
      std::operator+(&local_1d8,"Command supported ",&local_198);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
      psVar7 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1f8.field_2._M_allocated_capacity = *psVar7;
        local_1f8.field_2._8_8_ = puVar5[3];
        local_1f8._M_dataplus._M_p = (pointer)paVar14;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *psVar7;
        local_1f8._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_1f8._M_string_length = puVar5[1];
      *puVar5 = psVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar14) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar15) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f8,"Command supported...","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar14) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Supported...","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar14) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      goto LAB_001103e6;
    }
    paVar15 = &local_198.field_2;
    local_198._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Command unsupported","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar15) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    local_198._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"unsupported","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_198);
    break;
  case (Frame)0x10:
    switch(*(ulong *)(f + 0x10) << 0x3b | *(ulong *)(f + 0x10) >> 5) {
    case 0:
      paVar15 = &local_198.field_2;
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"Enable writes to all commands","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar15) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Enable...","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar15) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"Enable all writes...","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      break;
    case 1:
      paVar15 = &local_198.field_2;
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,
                 "Disable all writes except to the WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND commands"
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar15) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Disable...","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar15) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,
                 "Disable all except WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND..."
                 ,"");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      break;
    case 2:
      paVar15 = &local_198.field_2;
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,
                 "Disable all writes except to the WRITE_PROTECT, OPERATION and PAGE commands","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar15) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Disable...","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar15) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"Disable all except WRITE_PROTECT, OPERATION and PAGE...","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      break;
    default:
      paVar15 = &local_198.field_2;
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Invalid Data!","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar15) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Invalid","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      break;
    case 4:
      paVar15 = &local_198.field_2;
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"Disable all writes except to the WRITE_PROTECT command","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar15) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"Disable...","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar15) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      local_198._M_dataplus._M_p = (pointer)paVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_198,"Disable all except WRITE_PROTECT...","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &local_198);
    }
    break;
  case (Frame)0x11:
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"<invalid>","");
    switch(*(uint *)(f + 0x10) >> 6 & 3) {
    case 0:
      pcVar9 = "Immediate off (no sequencing)";
      goto LAB_0010e563;
    case 1:
      pcVar9 = "Soft off (with sequencing)";
LAB_0010e563:
      std::__cxx11::string::operator=((string *)&local_198,pcVar9);
      break;
    case 2:
      std::__cxx11::string::operator=((string *)&local_198,"Unit on");
    }
    int2str_sal_abi_cxx11_(&local_1f8,*(U64 *)(f + 0x10),display_base,8);
    std::operator+(&local_138,"Operation params ",&local_1f8);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158.field_2._8_8_ = puVar5[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_158._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_198._M_dataplus._M_p);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178.field_2._8_8_ = puVar5[3];
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_178._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    paVar15 = &local_1b8.field_2;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    paVar14 = &local_1d8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_1f8);
    local_1d8._M_dataplus._M_p = (pointer)paVar14;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Operation params...","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    local_1b8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    std::__cxx11::string::append((char *)&local_1b8);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = puVar5[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    break;
  case (Frame)0x12:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,8);
    local_d8 = "CONTROL is active high";
    if ((*(ulong *)(f + 0x10) & 2) == 0) {
      local_d8 = "CONTROL is active low";
    }
    std::operator+(&local_90,"Params ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_f8.field_2._M_allocated_capacity = *puVar8;
      local_f8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar8;
      local_f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_f8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_118.field_2._M_allocated_capacity = *psVar7;
      local_118.field_2._8_8_ = plVar6[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar7;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_138.field_2._M_allocated_capacity = *psVar7;
      local_138.field_2._8_8_ = plVar6[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar7;
      local_138._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_138._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_158.field_2._M_allocated_capacity = *psVar7;
      local_158.field_2._8_8_ = plVar6[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar7;
      local_158._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178.field_2._8_8_ = plVar6[3];
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_178._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    paVar15 = &local_1d8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    paVar14 = &local_1f8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    std::operator+(&local_1b8,"Params ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    std::operator+(&local_178,"Params ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::operator+(&local_138,"Params ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_158.field_2._M_allocated_capacity = *psVar7;
      local_158.field_2._8_8_ = plVar6[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar7;
      local_158._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178.field_2._8_8_ = plVar6[3];
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_178._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    std::operator+(&local_f8,"Params ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_118.field_2._M_allocated_capacity = *puVar8;
      local_118.field_2._8_8_ = plVar6[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar8;
      local_118._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_118._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_138.field_2._M_allocated_capacity = *puVar8;
      local_138.field_2._8_8_ = puVar5[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar8;
      local_138._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_138._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158.field_2._8_8_ = puVar5[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_158._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178.field_2._8_8_ = puVar5[3];
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_178._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = puVar5[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
      local_1f8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    paVar15 = &local_f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    _Var13._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
      _Var13._M_p = local_f8._M_dataplus._M_p;
    }
    goto LAB_0010e4ec;
  case (Frame)0x13:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,8);
    uVar2 = *(ulong *)(f + 0x10);
    paVar15 = &local_178.field_2;
    local_178._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    std::__cxx11::string::append((char *)&local_178);
    int2str_sal_abi_cxx11_(&local_158,uVar2 >> 5 & 0xff,display_base,3);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      uVar11 = local_178.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_178._M_string_length + local_158._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        uVar11 = local_158.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_178._M_string_length + local_158._M_string_length)
      goto LAB_0010c04c;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_158,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
    }
    else {
LAB_0010c04c:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_158._M_dataplus._M_p)
      ;
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
    paVar14 = &local_1d8.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = puVar5[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_138,(ulong)((uint)uVar2 & 0x1f),display_base,5);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      uVar11 = local_1d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_138._M_string_length + local_1d8._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        uVar11 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_138._M_string_length + local_1d8._M_string_length)
      goto LAB_0010eb38;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_138,0,(char *)0x0,(ulong)local_1d8._M_dataplus._M_p);
    }
    else {
LAB_0010eb38:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_138._M_dataplus._M_p)
      ;
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    goto LAB_001103e6;
  case (Frame)0x14:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,0x10);
    std::operator+(&local_1d8,"BatteryMode ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    paVar15 = &local_1d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    local_1b8._M_dataplus._M_p = (pointer)0x0;
    local_1b8._M_string_length = 0;
    local_1b8.field_2._M_allocated_capacity = 0;
    BitFieldToDescAll(BatteryModeBits,*(U64 *)(f + 0x10),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1b8);
    pbVar12 = &local_1d8;
    local_1d8._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)pbVar12,"");
    AddResultStringsFromVector
              ((SMBusAnalyzerResults *)pbVar12,&local_1f8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1b8,&local_1d8,results);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::__cxx11::string::swap
              ((string *)
               (results->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    pbVar12 = &local_1b8;
    goto LAB_0010ce88;
  case (Frame)0x15:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,0x10);
    std::operator+(&local_1d8,"BatteryStatus ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    paVar15 = &local_1d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    local_178._M_dataplus._M_p = (pointer)0x0;
    local_178._M_string_length = 0;
    local_178.field_2._M_allocated_capacity = 0;
    BitFieldToDescAll(BatteryStatusBits,*(U64 *)(f + 0x10),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_178);
    std::__cxx11::string::string
              ((string *)&local_1b8,ErrorCodesDesc[*(uint *)(f + 0x10) & 7],(allocator *)&local_158)
    ;
    pbVar12 = &local_1b8;
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)pbVar12,0,(char *)0x0,0x1168d9);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = puVar5[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    AddResultStringsFromVector
              ((SMBusAnalyzerResults *)pbVar12,&local_1f8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_178,&local_1d8,results);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    std::__cxx11::string::swap
              ((string *)
               (results->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    pbVar12 = &local_178;
LAB_0010ce88:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pbVar12);
LAB_0010e4e8:
    paVar15 = &local_1f8.field_2;
    _Var13._M_p = local_1f8._M_dataplus._M_p;
LAB_0010e4ec:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p != paVar15) {
LAB_001103d8:
      operator_delete(_Var13._M_p);
    }
LAB_001103e6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_001103f0;
    goto LAB_001103eb;
  case (Frame)0x16:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,0x10);
    uVar2 = *(ulong *)(f + 0x10);
    std::operator+(&local_90,"SpecificationInfo ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_d8 = (char *)(ulong)((uint)uVar2 & 0xf);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_f8.field_2._M_allocated_capacity = *puVar8;
      local_f8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar8;
      local_f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_f8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_b0,(U64)local_d8,display_base,4);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar11 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_b0._M_string_length + local_f8._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar11 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_b0._M_string_length + local_f8._M_string_length) goto LAB_0010ca55;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_b0,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
    }
    else {
LAB_0010ca55:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_b0._M_dataplus._M_p);
    }
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_118.field_2._M_allocated_capacity = *puVar8;
      local_118.field_2._8_8_ = puVar5[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar8;
      local_118._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_118._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_138.field_2._M_allocated_capacity = *puVar8;
      local_138.field_2._8_8_ = plVar6[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar8;
      local_138._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_138._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    i_01 = (ulong)((uint)(uVar2 >> 4) & 0xf);
    int2str_sal_abi_cxx11_(&local_d0,i_01,display_base,4);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      uVar11 = local_138.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_d0._M_string_length + local_138._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar11 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_d0._M_string_length + local_138._M_string_length) goto LAB_0010ea04;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_d0,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
    }
    else {
LAB_0010ea04:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_d0._M_dataplus._M_p);
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158.field_2._8_8_ = puVar5[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_158._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
    i_00 = (ulong)((uint)(uVar2 >> 8) & 0xf);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178.field_2._8_8_ = plVar6[3];
    }
    else {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_178._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_50,i_00,display_base,4);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      uVar11 = local_178.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_178._M_string_length + local_50._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar11 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_178._M_string_length + local_50._M_string_length) goto LAB_0010edda;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
    }
    else {
LAB_0010edda:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_50._M_dataplus._M_p);
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_70,uVar2 >> 0xc & 0xff,display_base,4);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      uVar11 = local_1d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_70._M_string_length + local_1d8._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar11 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_70._M_string_length + local_1d8._M_string_length) goto LAB_0010f267;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_70,0,(char *)0x0,(ulong)local_1d8._M_dataplus._M_p);
    }
    else {
LAB_0010f267:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_70._M_dataplus._M_p);
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    paVar15 = &local_1b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    std::operator+(&local_178,"SpecificationInfo ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_158,(U64)local_d8,display_base,4);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      uVar11 = local_1b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1b8._M_string_length + local_158._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        uVar11 = local_158.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_1b8._M_string_length + local_158._M_string_length)
      goto LAB_0010f4dc;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_158,0,(char *)0x0,(ulong)local_1b8._M_dataplus._M_p);
    }
    else {
LAB_0010f4dc:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_158._M_dataplus._M_p)
      ;
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::operator+(&local_138,"SpecificationInfo ",&local_198);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158.field_2._8_8_ = plVar6[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_158._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_118,(U64)local_d8,display_base,4);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      uVar11 = local_158.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_118._M_string_length + local_158._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        uVar11 = local_118.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_118._M_string_length + local_158._M_string_length)
      goto LAB_0010f70f;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_118,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
    }
    else {
LAB_0010f70f:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_118._M_dataplus._M_p)
      ;
    }
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178.field_2._8_8_ = puVar5[3];
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar7;
      local_178._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_178._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_178);
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_f8,i_01,display_base,4);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      uVar11 = local_1b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1b8._M_string_length + local_f8._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        uVar11 = local_f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_1b8._M_string_length + local_f8._M_string_length) goto LAB_0010f84a;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_f8,0,(char *)0x0,(ulong)local_1b8._M_dataplus._M_p);
    }
    else {
LAB_0010f84a:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_f8._M_dataplus._M_p);
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    std::operator+(&local_f8,"SpecificationInfo ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_118.field_2._M_allocated_capacity = *puVar8;
      local_118.field_2._8_8_ = puVar5[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *puVar8;
      local_118._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_118._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_90,(U64)local_d8,display_base,4);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar11 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_90._M_string_length + local_118._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar11 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_90._M_string_length + local_118._M_string_length) goto LAB_0010facb;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p);
    }
    else {
LAB_0010facb:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_90._M_dataplus._M_p);
    }
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_138.field_2._M_allocated_capacity = *puVar8;
      local_138.field_2._8_8_ = puVar5[3];
    }
    else {
      local_138.field_2._M_allocated_capacity = *puVar8;
      local_138._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_138._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158.field_2._8_8_ = puVar5[3];
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_158._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_b0,i_01,display_base,4);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      uVar11 = local_158.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_b0._M_string_length + local_158._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar11 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_b0._M_string_length + local_158._M_string_length) goto LAB_0010fc31;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_b0,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
    }
    else {
LAB_0010fc31:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_b0._M_dataplus._M_p);
    }
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178.field_2._8_8_ = puVar5[3];
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    else {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_178._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = puVar5[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_d0,i_00,display_base,4);
    paVar14 = &local_1d8.field_2;
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      uVar11 = local_1b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_1b8._M_string_length + local_d0._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar11 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_1b8._M_string_length + local_d0._M_string_length) goto LAB_0010fd7c;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_d0,0,(char *)0x0,(ulong)local_1b8._M_dataplus._M_p);
    }
    else {
LAB_0010fd7c:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_d0._M_dataplus._M_p);
    }
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = puVar5[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = plVar6[3];
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar15) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
    std::operator+(&local_1d8,"SpecificationInfo ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1f8);
    _Var13._M_p = local_1d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
      _Var13._M_p = local_1d8._M_dataplus._M_p;
    }
    goto LAB_0010ffcc;
  case (Frame)0x17:
    int2str_sal_abi_cxx11_(&local_198,*(U64 *)(f + 0x10),display_base,0x10);
    uVar2 = *(ulong *)(f + 0x10);
    int2str_sal_abi_cxx11_(&local_158,(ulong)((uint)(uVar2 >> 5) & 0xf),Decimal,0x40);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
    paVar15 = &local_178.field_2;
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178.field_2._8_8_ = puVar5[3];
      local_178._M_dataplus._M_p = (pointer)paVar15;
    }
    else {
      local_178.field_2._M_allocated_capacity = *puVar8;
      local_178._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_178._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_138,(ulong)((uint)uVar2 & 0x1f),Decimal,0x40);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      uVar11 = local_178.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_178._M_string_length + local_138._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        uVar11 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_178._M_string_length + local_138._M_string_length)
      goto LAB_0010cb00;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_138,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
    }
    else {
LAB_0010cb00:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_138._M_dataplus._M_p)
      ;
    }
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar7;
      local_1b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    paVar14 = &local_1d8.field_2;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    int2str_sal_abi_cxx11_(&local_118,(ulong)((uint)(uVar2 >> 9) & 0x9f) + 0x7bc,Decimal,0x40);
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      uVar11 = local_1d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_118._M_string_length + local_1d8._M_string_length) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        uVar11 = local_118.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_118._M_string_length + local_1d8._M_string_length)
      goto LAB_0010ec79;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_118,0,(char *)0x0,(ulong)local_1d8._M_dataplus._M_p);
    }
    else {
LAB_0010ec79:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_118._M_dataplus._M_p)
      ;
    }
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8.field_2._8_8_ = puVar5[3];
    }
    else {
      local_1f8.field_2._M_allocated_capacity = *psVar7;
      local_1f8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1f8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)psVar7 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    paVar1 = &local_1b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    std::operator+(&local_178,"ManufactureDate ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8.field_2._8_8_ = puVar5[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar8;
      local_1b8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_1b8,(ulong)local_1f8._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8.field_2._8_8_ = plVar6[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar7;
      local_1d8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar15) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::operator+(&local_1b8,"ManufactureDate ",&local_198);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b8);
    puVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8.field_2._8_8_ = puVar5[3];
      local_1d8._M_dataplus._M_p = (pointer)paVar14;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar8;
      local_1d8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1d8._M_string_length = puVar5[1];
    *puVar5 = puVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar14) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&local_198);
LAB_001103ca:
    pbVar12 = &local_1f8;
    _Var13._M_p = local_1f8._M_dataplus._M_p;
LAB_001103d3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var13._M_p == &pbVar12->field_2) goto LAB_001103e6;
    goto LAB_001103d8;
  default:
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,".","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &local_198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
LAB_001103eb:
    operator_delete(local_198._M_dataplus._M_p);
  }
LAB_001103f0:
  if ((*(undefined8 **)(f + 0x18) != (undefined8 *)0x0) && (f[0x20] != (Frame)0x9)) {
    std::__cxx11::string::string
              ((string *)&local_1f8,(char *)**(undefined8 **)(f + 0x18),(allocator *)&local_1d8);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x116938);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_198.field_2._M_allocated_capacity = *psVar7;
      local_198.field_2._8_8_ = plVar6[3];
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    }
    else {
      local_198.field_2._M_allocated_capacity = *psVar7;
      local_198._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_198._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append
              ((char *)(results->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,(ulong)local_198._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void SMBusAnalyzerResults::GetBubbleText( const Frame& f, DisplayBase display_base, std::vector<std::string>& results )
{
    results.clear();

    if( f.mType == SMB_Start )
    {
        if( mSettings->mDecodeLevel == DL_Signals )
            results.push_back( "Start" );
    }
    else if( f.mType == SMB_Stop )
    {
        if( mSettings->mDecodeLevel == DL_Signals )
            results.push_back( "Stop" );
    }
    else if( f.mType == SMB_Zero )
        results.push_back( "0" );
    else if( f.mType == SMB_One )
        results.push_back( "1" );
    else if( f.mType == SMB_ACK )
        results.push_back( "ACK" );
    else if( f.mType == SMB_NACK )
        results.push_back( "NACK" );
    else if( f.mType == FT_Byte )
    {
        std::string num( int2str_sal( f.mData1, display_base, 8 ) );
        results.push_back( "Byte " + num + ( ( f.mFlags & F_IsAcked ) ? " ACK" : " NACK" ) );
        results.push_back( "Byte " + num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num );
    }
    else if( f.mType == FT_Word )
    {
        std::string num( int2str_sal( f.mData1, display_base, 16 ) );

        results.push_back( "Word " + num + ( ( f.mFlags & F_IsAcked ) ? " ACK" : " NACK" ) );
        results.push_back( "Word " + num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num );
    }
    else if( f.mType == FT_PEC )
    {
        std::string readPEC( int2str_sal( f.mData1, display_base, 8 ) );
        std::string calcedPEC( int2str_sal( f.mData2, display_base, 8 ) );

        if( f.mData1 == f.mData2 )
        {
            results.push_back( "PEC " + readPEC + " OK" );
            results.push_back( readPEC + " OK" );
            results.push_back( "PEC OK" );
        }
        else
        {
            results.push_back( "Bad PEC " + readPEC + " should be " + calcedPEC );
            results.push_back( readPEC + " bad PEC!" );
            results.push_back( "Bad PEC!" );
        }

        results.push_back( readPEC );
    }
    else if( f.mType == FT_Address )
    {
        std::string addr( int2str_sal( f.mData1, display_base, 7 ) );
        std::string rw = ( f.mFlags & F_IsRead ) ? "Read " : "Write ";
        std::string rw_s = ( f.mFlags & F_IsRead ) ? "R " : "W ";
        const bool is_acked = f.mFlags & F_IsAcked;

        results.push_back( rw + "address " + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( addr );
        results.push_back( addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw + addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( rw_s + addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw_s + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( rw_s + "addr " + addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw_s + "address " + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( rw + "addr " + addr + ( is_acked ? " A" : " N" ) );
    }
    else if( f.mType == FT_ByteCount )
    {
        std::string bc_str( int2str_sal( f.mData1, display_base, 7 ) );

        results.push_back( "Byte count " + bc_str );
        results.push_back( "ByteCount " + bc_str );
        results.push_back( "Cnt " + bc_str );
        results.push_back( bc_str );
    }
    else if( f.mType == FT_CmdPMBus || f.mType == FT_CmdSmartBattery )
    {
        CommandDesc cmd;
        if( f.mType == FT_CmdPMBus )
            cmd = GetPMBusCommandDesc( f.mData1 );
        else
            cmd = GetSmartBatteryCommandDesc( f.mData1 );

        std::string id( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Command " + std::string( cmd.name ) + " " + id );
        results.push_back( id );
        results.push_back( cmd.name );
        results.push_back( "Cmd " + std::string( cmd.name ) );
        results.push_back( "Cmd " + id );
        results.push_back( "Cmd " + std::string( cmd.name ) + " " + id );
        results.push_back( "Command " + std::string( cmd.name ) );
        results.push_back( "Command " + id );
    }
    else if( f.mType == FT_CmdSMBus )
    {
        std::string id( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Command " + id );
        results.push_back( id );
        results.push_back( "Cmd " + id );
    }
    else if( f.mType == FT_PMBusCapability )
    {
        U8 bm = ( U8 )f.mData1;
        const char* pec_desc = ( f.mData1 & 0x80 ? "PEC unsupported, " : "PEC supported, " );

        const char* max_bus_speed;
        switch( f.mData1 & 0x60 )
        {
        case 0x00:
            max_bus_speed = "Max bus speed 100KHz, ";
            break;
        case 0x20:
            max_bus_speed = "Max bus speed 400KHz, ";
            break;
        default:
            max_bus_speed = "Reserved, ";
            break;
        }

        const char* smbalert_desc = ( ( f.mData1 & 0x10 ) ? "SMBALERT supported " : "SMBALERT unsupported " );

        std::string val_str( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Capability data byte " + val_str + " " + pec_desc + max_bus_speed + smbalert_desc );
        results.push_back( val_str );
        results.push_back( "Capability " + val_str + " ..." );
        results.push_back( "Capability " + val_str + " " + pec_desc + "..." );
        results.push_back( "Capability " + val_str + " " + pec_desc + max_bus_speed + "..." );
    }
    else if( f.mType == FT_PMBusQuery )
    {
        U8 bm = ( U8 )f.mData1;

        // command supported?
        if( bm & 0x80 )
        {
            std::string for_write = ( bm & 0x40 ) ? "for write" : "";
            const char* for_read = ( bm & 0x20 ) ? "for read" : "";
            const char* format;
            switch( bm & 0x1C )
            {
            case 0x00:
                format = "Linear data format";
                break;
            case 0x0C:
                format = "Direct mode format";
                break;
            case 0x14:
                format = "VID mode format";
                break;
            case 0x18:
                format = "Manufacturer specific format";
                break;
            default:
                format = "error format";
                break;
            }

            results.push_back( "Command supported " + for_write + for_read + format );
            results.push_back( "Command supported " + for_write + for_read + "..." );
            results.push_back( "Command supported " + for_write + "..." );
            results.push_back( "Command supported..." );
            results.push_back( "Supported..." );
        }
        else
        {
            results.push_back( "Command unsupported" );
            results.push_back( "unsupported" );
        }
    }
    else if( f.mType == FT_PMBusWriteProtect )
    {
        switch( f.mData1 )
        {
        case 0x80:
            results.push_back( "Disable all writes except to the WRITE_PROTECT command" );
            results.push_back( "Disable..." );
            results.push_back( "Disable all except WRITE_PROTECT..." );
            break;
        case 0x40:
            results.push_back( "Disable all writes except to the WRITE_PROTECT, OPERATION and PAGE commands" );
            results.push_back( "Disable..." );
            results.push_back( "Disable all except WRITE_PROTECT, OPERATION and PAGE..." );
            break;
        case 0x20:
            results.push_back( "Disable all writes except to the WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND commands" );
            results.push_back( "Disable..." );
            results.push_back( "Disable all except WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND..." );
            break;
        case 0x00:
            results.push_back( "Enable writes to all commands" );
            results.push_back( "Enable..." );
            results.push_back( "Enable all writes..." );
            break;
        default:
            results.push_back( "Invalid Data!" );
            results.push_back( "Invalid" );
            break;
        }
    }
    else if( f.mType == FT_PMBusOperation )
    {
        std::string unit_on_off = "<invalid>";
        const char* margin_state = "<invalid>";
        switch( f.mData1 & 0xC0 )
        {
        case 0x00:
            unit_on_off = "Immediate off (no sequencing)";
            margin_state = "N/A";
            break;
        case 0x40:
            unit_on_off = "Soft off (with sequencing)";
            margin_state = "N/A";
            break;
        case 0x80:
            unit_on_off = "Unit on";
            switch( f.mData1 & 0x3C )
            {
            case 0x14:
                margin_state = "Margin low (ignore fault)";
                break;
            case 0x18:
                margin_state = "Margin low (act on fault)";
                break;
            case 0x24:
                margin_state = "Margin high (ignore fault)";
                break;
            case 0x28:
                margin_state = "Margin high (act on fault)";
                break;
            }
            break;
        }

        std::string val( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Operation params " + val + " Unit on/off=" + unit_on_off + ", Margin state=" + margin_state );
        results.push_back( val );
        results.push_back( "Operation params..." );
        results.push_back( unit_on_off + ", " + margin_state );
    }
    else if( f.mType == FT_PMBusOnOffConfig )
    {
        std::string val( int2str_sal( f.mData1, display_base, 8 ) );

        const char* power_up = ( f.mData1 & 0x10 ) ? "CONTROL pin and OPERATION command" : "Any time";
        const char* commands =
            ( f.mData1 & 0x08 ) ? "Acknowledge on/off portion of OPERATION command" : "Ignore on/off portion of OPERATION command";
        const char* control = ( f.mData1 & 0x04 ) ? "CONTROL pin required to operate" : "Ignore CONTROL pin";
        const char* polarity = ( f.mData1 & 0x02 ) ? "CONTROL is active high" : "CONTROL is active low";
        const char* action = ( f.mData1 & 0x01 ) ? "Turn off the output as fast as possible" : "Use programmed turn off delay";

        results.push_back( "Params " + val + ": " + power_up + ", " + commands + ", " + polarity + ", " + action );
        results.push_back( val );
        results.push_back( "Params " + val + ": " + power_up );
        results.push_back( "Params " + val + ": " + power_up + "..." );
        results.push_back( "Params " + val + ": " + power_up + ", " + commands + "..." );
        results.push_back( "Params " + val + ": " + power_up + ", " + commands + ", " + polarity + "..." );
    }
    else if( f.mType == FT_PMBusVoutMode )
    {
        std::string val( int2str_sal( f.mData1, display_base, 8 ) );

        U8 mode = U8( f.mData1 >> 5 );
        U8 param = U8( f.mData1 & 0x1F );

        results.push_back( val + " Mode: " + int2str_sal( mode, display_base, 3 ) + " Param: " + int2str_sal( param, display_base, 5 ) );
        results.push_back( val );
    }
    else if( f.mType == FT_SmartBattBatteryMode )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );
        std::string prefix( "BatteryMode " + val + " " );

        std::vector<std::string> v;
        BitFieldToDescAll( BatteryModeBits, f.mData1, v );

        AddResultStringsFromVector( prefix, v, "", results );

        // make sure the longest description is the first in the vector
        std::swap( results.front(), results.back() );

        results.push_back( val );
    }
    else if( f.mType == FT_SmartBattBatteryStatus )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );
        std::string prefix( "BatteryStatus " + val + " " );

        std::vector<std::string> v;
        BitFieldToDescAll( BatteryStatusBits, f.mData1, v );

        AddResultStringsFromVector( prefix, v, "ErrorCode=" + std::string( ErrorCodesDesc[ f.mData1 & 0x07 ] ), results );

        // make sure the longest description is the first in the vector
        std::swap( results.front(), results.back() );

        results.push_back( val );
    }
    else if( f.mType == FT_SmartBattSpecificationInfo )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );

        U8 revision = f.mData1 & 0x0f;
        U8 version = ( f.mData1 >> 4 ) & 0x0f;
        U8 vscale = ( f.mData1 >> 8 ) & 0x0f;
        U8 ipscale = U8( f.mData1 >> 12 );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) +
                           " Version=" + int2str_sal( version, display_base, 4 ) + " VScale=" + int2str_sal( vscale, display_base, 4 ) +
                           " IPScale=" + int2str_sal( ipscale, display_base, 4 ) );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) + ", ..." );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) +
                           " Version=" + int2str_sal( version, display_base, 4 ) + ", ..." );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) + " Version=" +
                           int2str_sal( version, display_base, 4 ) + " VScale=" + int2str_sal( vscale, display_base, 4 ) + ", ..." );

        results.push_back( val );
        results.push_back( "SpecificationInfo " + val + " ..." );
    }
    else if( f.mType == FT_SmartBattManufactureDate )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );

        U8 day = f.mData1 & 0x1f;            // 5 bits
        U8 month = ( f.mData1 >> 5 ) & 0x0f; // 4 bits
        U16 year = ( f.mData1 >> 9 ) & 0x9f; // 7 bits
        year += 1980;

        std::string date( int2str( month ) + "/" + int2str( day ) + "/" + int2str( year ) );

        results.push_back( "ManufactureDate " + val + " " + date );
        results.push_back( "ManufactureDate " + val + " ..." );
        results.push_back( val );
    }
    else
    {
        results.push_back( "." );
    }

    // add the protocol name
    if( f.mData2 != 0 && f.mType != FT_PEC )
    {
        const SMBusProtocol* pProt = ( const SMBusProtocol* )f.mData2;
        results.front() += " Protocol=" + std::string( pProt->name );
    }
}